

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void __thiscall
xLearn::AUCMetric::Accumulate
          (AUCMetric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  pointer puVar1;
  ulong uVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  ostream *poVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  index_t j;
  long lVar13;
  long lVar14;
  allocator local_c2;
  allocator local_c1;
  vector<float,_std::allocator<float>_> *local_c0;
  vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> info;
  string local_a0;
  vector<float,_std::allocator<float>_> *local_80;
  vector<float,_std::allocator<float>_> *local_78;
  Info single_info;
  
  local_c0 = Y;
  if ((long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
            _M_start ==
      (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    Info::Info(&single_info);
    std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::vector
              (&info,(this->super_Metric).threadNumber_,&single_info,(allocator_type *)&local_a0);
    lVar14 = 0;
    uVar10 = 0;
    while (uVar2 = (this->super_Metric).threadNumber_, uVar10 < uVar2) {
      uVar6 = (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      uVar7 = uVar6 / uVar2;
      sVar8 = uVar7 * (uVar10 + 1);
      local_a0.field_2._M_allocated_capacity = uVar7 * uVar10;
      local_a0._M_dataplus._M_p = (pointer)auc_accum_thread;
      local_a0._M_string_length = uVar6 % uVar2 + sVar8;
      if (uVar10 != uVar2 - 1) {
        local_a0._M_string_length = sVar8;
      }
      local_a0.field_2._8_8_ =
           CONCAT44(info.
                    super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    info.
                    super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar14;
      local_78 = local_c0;
      local_80 = pred;
      ThreadPool::
      enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long)>>
                ((ThreadPool *)&stack0xffffffffffffffc0,
                 (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long)>
                  *)(this->super_Metric).pool_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      lVar14 = lVar14 + 0x30;
      uVar10 = uVar10 + 1;
    }
    ThreadPool::Sync((this->super_Metric).pool_,(int)uVar2);
    lVar14 = CONCAT44(info.
                      super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      info.
                      super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_);
    puVar3 = (this->all_positive_number_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->all_negative_number_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar11 = 0;
        (ulong)uVar11 <
        (ulong)(((long)info.
                       super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar14) / 0x30);
        uVar11 = uVar11 + 1) {
      lVar12 = (ulong)uVar11 * 0x30;
      lVar5 = *(long *)(lVar14 + lVar12);
      lVar12 = *(long *)(lVar14 + 0x18 + lVar12);
      for (lVar13 = 0; lVar13 != 1000000; lVar13 = lVar13 + 1) {
        puVar1 = puVar3 + lVar13;
        *puVar1 = *puVar1 + *(int *)(lVar5 + lVar13 * 4);
        puVar1 = puVar4 + lVar13;
        *puVar1 = *puVar1 + *(int *)(lVar12 + lVar13 * 4);
      }
    }
    std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::~vector(&info);
    Info::~Info(&single_info);
    return;
  }
  info.super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>._M_impl
  .super__Vector_impl_data._M_start._0_4_ = 2;
  std::__cxx11::string::string
            ((string *)&single_info,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             &local_c1);
  std::__cxx11::string::string((string *)&local_a0,"Accumulate",&local_c2);
  poVar9 = Logger::Start(ERR,(string *)&single_info,0x205,&local_a0);
  poVar9 = std::operator<<(poVar9,"CHECK_EQ failed ");
  poVar9 = std::operator<<(poVar9,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
                          );
  poVar9 = std::operator<<(poVar9,":");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x205);
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"Y.size()");
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"pred.size()");
  poVar9 = std::operator<<(poVar9," = ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&single_info);
  Logger::~Logger((Logger *)&info);
  abort();
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    // multi-thread
    Info single_info;
    std::vector<Info> info(threadNumber_, single_info);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(auc_accum_thread,
                               &Y,
                               &pred,
                               &(info[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all thread finish their job
    pool_->Sync(threadNumber_);
    for (index_t i = 0; i < info.size(); ++i) {
      for (index_t j = 0; j < kMaxBucketSize; ++j) {
        all_positive_number_[j] += info[i].positive_vec_[j];
        all_negative_number_[j] += info[i].negative_vec_[j];
      }
    } 
  }